

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgSequenceOptimizer.cpp
# Opt level: O0

double TasGrid::Optimizer::getDerivative<(TasGrid::TypeOneDRule)15>
                 (CurrentNodes<(TasGrid::TypeOneDRule)15> *current,double x)

{
  uchar *tbs;
  size_t *siglen;
  uchar *sig;
  EVP_PKEY_CTX *ctx;
  size_t in_R8;
  double extraout_XMM0_Qa;
  double dVar1;
  uchar *local_40;
  size_t i;
  double sum;
  vector<double,_std::allocator<double>_> lag;
  double x_local;
  CurrentNodes<(TasGrid::TypeOneDRule)15> *current_local;
  
  lag.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)x;
  evalLagrange((vector<double,_std::allocator<double>_> *)&sum,&current->nodes,&current->coeff,x);
  i = 0;
  local_40 = (uchar *)0x0;
  while( true ) {
    tbs = (uchar *)::std::vector<double,_std::allocator<double>_>::size
                             ((vector<double,_std::allocator<double>_> *)&sum);
    if (tbs <= local_40) break;
    ctx = (EVP_PKEY_CTX *)&sum;
    sig = local_40;
    ::std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)ctx,(size_type)local_40);
    Maths::sign(ctx,sig,siglen,tbs,in_R8);
    dVar1 = differentiateBasis(&current->nodes,&current->coeff,(size_t)local_40,
                               (double)lag.super__Vector_base<double,_std::allocator<double>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    i = (size_t)(extraout_XMM0_Qa * dVar1 + (double)i);
    local_40 = local_40 + 1;
  }
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&sum);
  return (double)i;
}

Assistant:

double getDerivative<rule_maxlebesgue>(CurrentNodes<rule_maxlebesgue> const& current, double x){
    std::vector<double> lag = evalLagrange(current.nodes, current.coeff, x);
    double sum = 0.0;
    for(size_t i=0; i<lag.size(); i++)
        sum += Maths::sign(lag[i]) * differentiateBasis(current.nodes, current.coeff, i, x);
    return sum;
}